

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_SanityCheckPass.h
# Opt level: O0

void __thiscall
soul::SanityCheckPass::PostResolutionChecks::visit(PostResolutionChecks *this,Processor *p)

{
  bool bVar1;
  uint uVar2;
  vector<soul::pool_ref<soul::AST::EndpointDeclaration>,_std::allocator<soul::pool_ref<soul::AST::EndpointDeclaration>_>_>
  *this_00;
  reference ppVar3;
  EndpointDeclaration *endpoint;
  vector<soul::pool_ref<soul::AST::VariableDeclaration>,_std::allocator<soul::pool_ref<soul::AST::VariableDeclaration>_>_>
  *this_01;
  VariableDeclaration *pVVar4;
  Expression *pEVar5;
  CompileMessage local_b0;
  reference local_78;
  pool_ref<soul::AST::VariableDeclaration> *v;
  iterator __end2_1;
  iterator __begin2_1;
  vector<soul::pool_ref<soul::AST::VariableDeclaration>,_std::allocator<soul::pool_ref<soul::AST::VariableDeclaration>_>_>
  *__range2_1;
  pool_ref<soul::AST::EndpointDeclaration> local_48;
  pool_ref<soul::AST::EndpointDeclaration> input;
  iterator __end2;
  iterator __begin2;
  vector<soul::pool_ref<soul::AST::EndpointDeclaration>,_std::allocator<soul::pool_ref<soul::AST::EndpointDeclaration>_>_>
  *__range2;
  Processor *local_18;
  Processor *p_local;
  PostResolutionChecks *this_local;
  
  local_18 = p;
  p_local = (Processor *)this;
  ASTVisitor::visit(&this->super_ASTVisitor,p);
  ArrayView<soul::pool_ref<soul::AST::Function>>::
  ArrayView<std::vector<soul::pool_ref<soul::AST::Function>,std::allocator<soul::pool_ref<soul::AST::Function>>>>
            ((ArrayView<soul::pool_ref<soul::AST::Function>> *)&__range2,&local_18->functions);
  checkForDuplicateFunctions(___range2);
  this_00 = &(local_18->super_ProcessorBase).endpoints;
  __end2 = std::
           vector<soul::pool_ref<soul::AST::EndpointDeclaration>,_std::allocator<soul::pool_ref<soul::AST::EndpointDeclaration>_>_>
           ::begin(this_00);
  input.object = (EndpointDeclaration *)
                 std::
                 vector<soul::pool_ref<soul::AST::EndpointDeclaration>,_std::allocator<soul::pool_ref<soul::AST::EndpointDeclaration>_>_>
                 ::end(this_00);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end2,(__normal_iterator<soul::pool_ref<soul::AST::EndpointDeclaration>_*,_std::vector<soul::pool_ref<soul::AST::EndpointDeclaration>,_std::allocator<soul::pool_ref<soul::AST::EndpointDeclaration>_>_>_>
                                     *)&input), bVar1) {
    ppVar3 = __gnu_cxx::
             __normal_iterator<soul::pool_ref<soul::AST::EndpointDeclaration>_*,_std::vector<soul::pool_ref<soul::AST::EndpointDeclaration>,_std::allocator<soul::pool_ref<soul::AST::EndpointDeclaration>_>_>_>
             ::operator*(&__end2);
    local_48.object = ppVar3->object;
    endpoint = pool_ref<soul::AST::EndpointDeclaration>::get(&local_48);
    checkEndpointDataTypes(endpoint);
    pool_ref<soul::AST::EndpointDeclaration>::~pool_ref(&local_48);
    __gnu_cxx::
    __normal_iterator<soul::pool_ref<soul::AST::EndpointDeclaration>_*,_std::vector<soul::pool_ref<soul::AST::EndpointDeclaration>,_std::allocator<soul::pool_ref<soul::AST::EndpointDeclaration>_>_>_>
    ::operator++(&__end2);
  }
  this_01 = &local_18->stateVariables;
  __end2_1 = std::
             vector<soul::pool_ref<soul::AST::VariableDeclaration>,_std::allocator<soul::pool_ref<soul::AST::VariableDeclaration>_>_>
             ::begin(this_01);
  v = (pool_ref<soul::AST::VariableDeclaration> *)
      std::
      vector<soul::pool_ref<soul::AST::VariableDeclaration>,_std::allocator<soul::pool_ref<soul::AST::VariableDeclaration>_>_>
      ::end(this_01);
  do {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2_1,
                       (__normal_iterator<soul::pool_ref<soul::AST::VariableDeclaration>_*,_std::vector<soul::pool_ref<soul::AST::VariableDeclaration>,_std::allocator<soul::pool_ref<soul::AST::VariableDeclaration>_>_>_>
                        *)&v);
    if (!bVar1) {
      return;
    }
    local_78 = __gnu_cxx::
               __normal_iterator<soul::pool_ref<soul::AST::VariableDeclaration>_*,_std::vector<soul::pool_ref<soul::AST::VariableDeclaration>,_std::allocator<soul::pool_ref<soul::AST::VariableDeclaration>_>_>_>
               ::operator*(&__end2_1);
    pVVar4 = pool_ref<soul::AST::VariableDeclaration>::operator->(local_78);
    bVar1 = pool_ptr<soul::AST::Expression>::operator!=(&pVVar4->initialValue,(void *)0x0);
    if (bVar1) {
      pVVar4 = pool_ref<soul::AST::VariableDeclaration>::operator->(local_78);
      pEVar5 = pool_ptr<soul::AST::Expression>::operator->(&pVVar4->initialValue);
      uVar2 = (*(pEVar5->super_Statement).super_ASTObject._vptr_ASTObject[0xe])();
      if ((uVar2 & 1) == 0) {
        pVVar4 = pool_ref<soul::AST::VariableDeclaration>::operator->(local_78);
        pEVar5 = pool_ptr<soul::AST::Expression>::operator->(&pVVar4->initialValue);
        Errors::expectedConstant<>();
        AST::Context::throwError(&(pEVar5->super_Statement).super_ASTObject.context,&local_b0,false)
        ;
      }
    }
    __gnu_cxx::
    __normal_iterator<soul::pool_ref<soul::AST::VariableDeclaration>_*,_std::vector<soul::pool_ref<soul::AST::VariableDeclaration>,_std::allocator<soul::pool_ref<soul::AST::VariableDeclaration>_>_>_>
    ::operator++(&__end2_1);
  } while( true );
}

Assistant:

void visit (AST::Processor& p) override
        {
            super::visit (p);
            checkForDuplicateFunctions (p.functions);

            for (auto input : p.endpoints)
                checkEndpointDataTypes (input.get());

            for (auto& v : p.stateVariables)
                if (v->initialValue != nullptr && ! v->initialValue->isCompileTimeConstant())
                    v->initialValue->context.throwError (Errors::expectedConstant());
        }